

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImGui::BeginCombo(char *label,char *preview_value,ImGuiComboFlags flags)

{
  float fVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  ImGuiID id;
  bool bVar4;
  bool bVar5;
  ImU32 IVar6;
  ImGuiWindow *pIVar7;
  ImGuiContext *g;
  ImDrawCornerFlags rounding_corners;
  uint uVar8;
  undefined1 auVar11 [16];
  float fVar9;
  ImVec2 IVar10;
  ulong extraout_XMM0_Qb;
  undefined1 auVar13 [64];
  undefined1 auVar12 [16];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar18 [16];
  undefined1 auVar19 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  ImRect IVar24;
  bool hovered;
  bool held;
  ImRect frame_bb;
  char name [16];
  ImRect r_outer;
  ImVec2 size_expected;
  ImVec2 pos;
  ImRect total_bb;
  bool local_e9;
  float local_e8;
  float local_e4;
  ImGuiID local_e0;
  bool local_d9;
  ImRect local_d8;
  ImVec2 local_c8 [2];
  undefined1 local_b8 [16];
  uint local_a4;
  char *local_a0;
  undefined1 local_98 [16];
  float local_88;
  float fStack_84;
  ulong uStack_80;
  char *local_70;
  ImVec2 local_68;
  ImRect local_60;
  ImVec2 local_50;
  ImVec2 local_48;
  ImRect local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [56];
  undefined1 auVar17 [56];
  undefined1 extraout_var_01 [56];
  undefined1 auVar20 [56];
  
  pIVar3 = GImGui;
  uVar8 = (GImGui->NextWindowData).Flags;
  (GImGui->NextWindowData).Flags = uVar8 & 0xffffffef;
  pIVar7 = pIVar3->CurrentWindow;
  pIVar7->WriteAccessed = true;
  if (pIVar7->SkipItems != false) {
    return false;
  }
  local_a0 = preview_value;
  if ((~flags & 0x60U) == 0) {
    __assert_fail("(flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x617,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  local_e0 = ImGuiWindow::GetID(pIVar7,label,(char *)0x0);
  local_e8 = 0.0;
  if ((flags & 0x20U) == 0) {
    local_e8 = GetFrameHeight();
  }
  IVar10 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_88 = IVar10.x;
  fStack_84 = IVar10.y;
  uStack_80 = extraout_XMM0_Qb;
  auVar13._0_4_ = CalcItemWidth();
  auVar13._4_60_ = extraout_var;
  local_98 = ZEXT416((uint)local_e8);
  if ((flags & 0x40U) == 0) {
    local_98 = auVar13._0_16_;
  }
  auVar2._4_4_ = fStack_84;
  auVar2._0_4_ = local_88;
  auVar2._8_8_ = uStack_80;
  auVar2 = vmovshdup_avx(auVar2);
  fVar9 = (pIVar3->Style).FramePadding.y;
  IVar10 = (pIVar7->DC).CursorPos;
  auVar12._8_8_ = 0;
  auVar12._0_4_ = IVar10.x;
  auVar12._4_4_ = IVar10.y;
  auVar2 = vinsertps_avx(local_98,ZEXT416((uint)(fVar9 + fVar9 + auVar2._0_4_)),0x10);
  auVar21._0_4_ = auVar2._0_4_ + IVar10.x;
  auVar21._4_4_ = auVar2._4_4_ + IVar10.y;
  auVar21._8_4_ = auVar2._8_4_ + 0.0;
  auVar21._12_4_ = auVar2._12_4_ + 0.0;
  local_d8 = (ImRect)vmovlhps_avx(auVar12,auVar21);
  fVar23 = 0.0;
  if (0.0 < local_88) {
    fVar23 = local_88 + (pIVar3->Style).ItemInnerSpacing.x;
  }
  auVar22._0_4_ = fVar23 + auVar21._0_4_;
  auVar22._4_4_ = auVar21._4_4_ + 0.0;
  auVar22._8_4_ = auVar21._8_4_ + 0.0;
  auVar22._12_4_ = auVar21._12_4_ + 0.0;
  local_40 = (ImRect)vmovlhps_avx(auVar12,auVar22);
  local_70 = label;
  ItemSize(&local_40,fVar9);
  id = local_e0;
  bVar4 = ItemAdd(&local_40,local_e0,&local_d8);
  if (!bVar4) {
    return false;
  }
  local_a4 = uVar8;
  bVar4 = ButtonBehavior(&local_d8,id,&local_e9,&local_d9,0);
  bVar5 = IsPopupOpen(id,0);
  IVar6 = GetColorU32(local_e9 + 7,1.0);
  local_b8 = ZEXT416((uint)local_d8.Min.x);
  local_e4 = local_d8.Max.x;
  RenderNavHighlight(&local_d8,id,1);
  auVar2 = vcmpss_avx(ZEXT416((uint)(local_e4 - local_e8)),local_b8,2);
  local_b8 = vblendvps_avx(ZEXT416((uint)(local_e4 - local_e8)),local_b8,auVar2);
  if ((flags & 0x40U) == 0) {
    local_c8[0].y = local_d8.Max.y;
    local_c8[0].x = (float)local_b8._0_4_;
    rounding_corners = 0xf;
    if ((flags & 0x20U) == 0) {
      rounding_corners = 5;
    }
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,&local_d8.Min,local_c8,IVar6,(pIVar3->Style).FrameRounding,
               rounding_corners);
  }
  if ((flags & 0x20U) == 0) {
    IVar6 = GetColorU32(((byte)(local_e9 | bVar5) & 1) + 0x15,1.0);
    local_e4 = (float)GetColorU32(0,1.0);
    local_c8[0].y = local_d8.Min.y;
    local_c8[0].x = (float)local_b8._0_4_;
    ImDrawList::AddRectFilled
              (pIVar7->DrawList,local_c8,&local_d8.Max,IVar6,(pIVar3->Style).FrameRounding,
               (uint)((float)local_98._0_4_ <= local_e8) * 5 + 10);
    if ((local_e8 + (float)local_b8._0_4_) - (pIVar3->Style).FramePadding.x <= local_d8.Max.x) {
      fVar9 = (pIVar3->Style).FramePadding.y;
      auVar2 = vinsertps_avx(ZEXT416((uint)(fVar9 + (float)local_b8._0_4_)),
                             ZEXT416((uint)(fVar9 + local_d8.Min.y)),0x10);
      RenderArrow(pIVar7->DrawList,auVar2._0_8_,(ImU32)local_e4,3,1.0);
    }
  }
  RenderFrameBorder(local_d8.Min,local_d8.Max,(pIVar3->Style).FrameRounding);
  uVar8 = local_a4;
  if (local_a0 != (char *)0x0 && (char)((flags & 0x40U) >> 6) == '\0') {
    IVar10 = (pIVar3->Style).FramePadding;
    auVar11._0_4_ = local_d8.Min.x + IVar10.x;
    auVar11._4_4_ = local_d8.Min.y + IVar10.y;
    auVar11._8_8_ = 0;
    local_c8[0] = (ImVec2)vmovlps_avx(auVar11);
    if (pIVar3->LogEnabled == true) {
      LogSetNextTextDecoration("{","}");
    }
    local_60.Min.y = local_d8.Max.y;
    local_60.Min.x = (float)local_b8._0_4_;
    local_50.x = 0.0;
    local_50.y = 0.0;
    RenderTextClipped(local_c8,&local_60.Min,local_a0,(char *)0x0,(ImVec2 *)0x0,&local_50,
                      (ImRect *)0x0);
  }
  IVar24 = local_d8;
  auVar20 = ZEXT856(uStack_80);
  if (0.0 < local_88) {
    auVar2 = vinsertps_avx(ZEXT416((uint)(pIVar3->Style).FramePadding.y),
                           ZEXT416((uint)(pIVar3->Style).ItemInnerSpacing.x),0x10);
    auVar18._8_8_ = 0;
    auVar18._0_4_ = local_d8.Min.y;
    auVar18._4_4_ = local_d8.Max.x;
    auVar2 = vshufps_avx(auVar2,auVar2,0xe1);
    auVar12 = vshufps_avx(auVar18,auVar18,0xe1);
    auVar20 = ZEXT856(auVar12._8_8_);
    IVar10.x = auVar12._0_4_ + auVar2._0_4_;
    IVar10.y = auVar12._4_4_ + auVar2._4_4_;
    local_d8 = IVar24;
    RenderText(IVar10,local_70,(char *)0x0,true);
  }
  if (bVar4) {
    if (!bVar5) goto LAB_0016aa5b;
  }
  else if (pIVar3->NavActivateId == local_e0 && !bVar5) {
LAB_0016aa5b:
    if ((pIVar7->DC).NavLayerCurrent == ImGuiNavLayer_Main) {
      pIVar7->NavLastIds[0] = local_e0;
    }
    OpenPopupEx(local_e0,0);
  }
  else if (!bVar5) {
    return false;
  }
  if ((uVar8 & 0x10) != 0) {
    *(byte *)&(pIVar3->NextWindowData).Flags = (byte)(pIVar3->NextWindowData).Flags | 0x10;
    auVar12 = ZEXT416((uint)(pIVar3->NextWindowData).SizeConstraintRect.Min.x);
    auVar2 = vcmpss_avx(local_98,auVar12,2);
    auVar20 = ZEXT856(auVar2._8_8_);
    auVar2 = vblendvps_avx(local_98,auVar12,auVar2);
    (pIVar3->NextWindowData).SizeConstraintRect.Min.x = auVar2._0_4_;
    goto LAB_0016ab68;
  }
  uVar8 = flags | 4;
  if ((flags & 0x1eU) != 0) {
    uVar8 = flags;
  }
  if (POPCOUNT(uVar8 & 0x1e) != 1) {
    __assert_fail("ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x656,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  if ((uVar8 & 4) == 0) {
    if ((uVar8 & 2) != 0) {
      fVar9 = 4.0;
      goto LAB_0016ab0d;
    }
    if ((uVar8 & 8) != 0) {
      fVar9 = 20.0;
      goto LAB_0016ab0d;
    }
    fVar9 = 3.4028235e+38;
  }
  else {
    fVar9 = 8.0;
LAB_0016ab0d:
    fVar23 = (GImGui->Style).WindowPadding.y;
    fVar1 = (GImGui->Style).ItemSpacing.y;
    auVar20 = (undefined1  [56])0x0;
    fVar9 = fVar23 + fVar23 + ((fVar1 + GImGui->FontSize) * fVar9 - fVar1);
  }
  local_c8[0].y = 0.0;
  local_c8[0].x = (float)local_98._0_4_;
  local_60.Min.y = fVar9;
  local_60.Min.x = 3.4028235e+38;
  SetNextWindowSizeConstraints(local_c8,&local_60.Min,(ImGuiSizeCallback)0x0,(void *)0x0);
  flags = uVar8;
LAB_0016ab68:
  ImFormatString((char *)local_c8,0x10,"##Combo_%02d",(ulong)(uint)(pIVar3->BeginPopupStack).Size);
  pIVar7 = FindWindowByName((char *)local_c8);
  if ((pIVar7 != (ImGuiWindow *)0x0) && (pIVar7->WasActive == true)) {
    auVar14._0_8_ = CalcWindowNextAutoFitSize(pIVar7);
    auVar14._8_56_ = extraout_var_00;
    local_50 = (ImVec2)vmovlps_avx(auVar14._0_16_);
    pIVar7->AutoPosLastDirection = (uint)((flags & 1U) == 0) * 3;
    auVar17 = extraout_var_00;
    IVar24 = GetWindowAllowedExtentRect(pIVar7);
    auVar19._0_8_ = IVar24.Max;
    auVar19._8_56_ = auVar20;
    auVar15._0_8_ = IVar24.Min;
    auVar15._8_56_ = auVar17;
    local_60 = (ImRect)vmovlhps_avx(auVar15._0_16_,auVar19._0_16_);
    auVar2 = vinsertps_avx((undefined1  [16])local_d8,ZEXT416((uint)local_d8.Max.y),0x10);
    local_68 = (ImVec2)vmovlps_avx(auVar2);
    auVar16._0_8_ =
         FindBestWindowPosForPopupEx
                   (&local_68,&local_50,&pIVar7->AutoPosLastDirection,&local_60,&local_d8,
                    ImGuiPopupPositionPolicy_ComboBox);
    auVar16._8_56_ = extraout_var_01;
    local_48 = (ImVec2)vmovlps_avx(auVar16._0_16_);
    local_68.x = 0.0;
    local_68.y = 0.0;
    SetNextWindowPos(&local_48,0,&local_68);
  }
  local_60.Min.y = (pIVar3->Style).WindowPadding.y;
  local_60.Min.x = (pIVar3->Style).FramePadding.x;
  PushStyleVar(1,&local_60.Min);
  bVar4 = Begin((char *)local_c8,(bool *)0x0,0x4000147);
  PopStyleVar(1);
  if (!bVar4) {
    EndPopup();
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui_widgets.cpp"
                  ,0x67b,"bool ImGui::BeginCombo(const char *, const char *, ImGuiComboFlags)");
  }
  return true;
}

Assistant:

bool ImGui::BeginCombo(const char* label, const char* preview_value, ImGuiComboFlags flags)
{
    // Always consume the SetNextWindowSizeConstraint() call in our early return paths
    ImGuiContext& g = *GImGui;
    bool has_window_size_constraint = (g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSizeConstraint) != 0;
    g.NextWindowData.Flags &= ~ImGuiNextWindowDataFlags_HasSizeConstraint;

    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    IM_ASSERT((flags & (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)) != (ImGuiComboFlags_NoArrowButton | ImGuiComboFlags_NoPreview)); // Can't use both flags together

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = window->GetID(label);

    const float arrow_size = (flags & ImGuiComboFlags_NoArrowButton) ? 0.0f : GetFrameHeight();
    const ImVec2 label_size = CalcTextSize(label, NULL, true);
    const float expected_w = CalcItemWidth();
    const float w = (flags & ImGuiComboFlags_NoPreview) ? arrow_size : expected_w;
    const ImRect frame_bb(window->DC.CursorPos, window->DC.CursorPos + ImVec2(w, label_size.y + style.FramePadding.y * 2.0f));
    const ImRect total_bb(frame_bb.Min, frame_bb.Max + ImVec2(label_size.x > 0.0f ? style.ItemInnerSpacing.x + label_size.x : 0.0f, 0.0f));
    ItemSize(total_bb, style.FramePadding.y);
    if (!ItemAdd(total_bb, id, &frame_bb))
        return false;

    bool hovered, held;
    bool pressed = ButtonBehavior(frame_bb, id, &hovered, &held);
    bool popup_open = IsPopupOpen(id, ImGuiPopupFlags_None);

    const ImU32 frame_col = GetColorU32(hovered ? ImGuiCol_FrameBgHovered : ImGuiCol_FrameBg);
    const float value_x2 = ImMax(frame_bb.Min.x, frame_bb.Max.x - arrow_size);
    RenderNavHighlight(frame_bb, id);
    if (!(flags & ImGuiComboFlags_NoPreview))
        window->DrawList->AddRectFilled(frame_bb.Min, ImVec2(value_x2, frame_bb.Max.y), frame_col, style.FrameRounding, (flags & ImGuiComboFlags_NoArrowButton) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Left);
    if (!(flags & ImGuiComboFlags_NoArrowButton))
    {
        ImU32 bg_col = GetColorU32((popup_open || hovered) ? ImGuiCol_ButtonHovered : ImGuiCol_Button);
        ImU32 text_col = GetColorU32(ImGuiCol_Text);
        window->DrawList->AddRectFilled(ImVec2(value_x2, frame_bb.Min.y), frame_bb.Max, bg_col, style.FrameRounding, (w <= arrow_size) ? ImDrawCornerFlags_All : ImDrawCornerFlags_Right);
        if (value_x2 + arrow_size - style.FramePadding.x <= frame_bb.Max.x)
            RenderArrow(window->DrawList, ImVec2(value_x2 + style.FramePadding.y, frame_bb.Min.y + style.FramePadding.y), text_col, ImGuiDir_Down, 1.0f);
    }
    RenderFrameBorder(frame_bb.Min, frame_bb.Max, style.FrameRounding);
    if (preview_value != NULL && !(flags & ImGuiComboFlags_NoPreview))
    {
        ImVec2 preview_pos = frame_bb.Min + style.FramePadding;
        if (g.LogEnabled)
            LogSetNextTextDecoration("{", "}");
        RenderTextClipped(preview_pos, ImVec2(value_x2, frame_bb.Max.y), preview_value, NULL, NULL, ImVec2(0.0f, 0.0f));
    }
    if (label_size.x > 0)
        RenderText(ImVec2(frame_bb.Max.x + style.ItemInnerSpacing.x, frame_bb.Min.y + style.FramePadding.y), label);

    if ((pressed || g.NavActivateId == id) && !popup_open)
    {
        if (window->DC.NavLayerCurrent == 0)
            window->NavLastIds[0] = id;
        OpenPopupEx(id, ImGuiPopupFlags_None);
        popup_open = true;
    }

    if (!popup_open)
        return false;

    if (has_window_size_constraint)
    {
        g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSizeConstraint;
        g.NextWindowData.SizeConstraintRect.Min.x = ImMax(g.NextWindowData.SizeConstraintRect.Min.x, w);
    }
    else
    {
        if ((flags & ImGuiComboFlags_HeightMask_) == 0)
            flags |= ImGuiComboFlags_HeightRegular;
        IM_ASSERT(ImIsPowerOfTwo(flags & ImGuiComboFlags_HeightMask_));    // Only one
        int popup_max_height_in_items = -1;
        if (flags & ImGuiComboFlags_HeightRegular)     popup_max_height_in_items = 8;
        else if (flags & ImGuiComboFlags_HeightSmall)  popup_max_height_in_items = 4;
        else if (flags & ImGuiComboFlags_HeightLarge)  popup_max_height_in_items = 20;
        SetNextWindowSizeConstraints(ImVec2(w, 0.0f), ImVec2(FLT_MAX, CalcMaxPopupHeightFromItemCount(popup_max_height_in_items)));
    }

    char name[16];
    ImFormatString(name, IM_ARRAYSIZE(name), "##Combo_%02d", g.BeginPopupStack.Size); // Recycle windows based on depth

    // Position the window given a custom constraint (peak into expected window size so we can position it)
    // This might be easier to express with an hypothetical SetNextWindowPosConstraints() function.
    if (ImGuiWindow* popup_window = FindWindowByName(name))
        if (popup_window->WasActive)
        {
            // Always override 'AutoPosLastDirection' to not leave a chance for a past value to affect us.
            ImVec2 size_expected = CalcWindowNextAutoFitSize(popup_window);
            if (flags & ImGuiComboFlags_PopupAlignLeft)
                popup_window->AutoPosLastDirection = ImGuiDir_Left; // "Below, Toward Left"
            else
                popup_window->AutoPosLastDirection = ImGuiDir_Down; // "Below, Toward Right (default)"
            ImRect r_outer = GetWindowAllowedExtentRect(popup_window);
            ImVec2 pos = FindBestWindowPosForPopupEx(frame_bb.GetBL(), size_expected, &popup_window->AutoPosLastDirection, r_outer, frame_bb, ImGuiPopupPositionPolicy_ComboBox);
            SetNextWindowPos(pos);
        }

    // We don't use BeginPopupEx() solely because we have a custom name string, which we could make an argument to BeginPopupEx()
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_AlwaysAutoResize | ImGuiWindowFlags_Popup | ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoMove;

    // Horizontally align ourselves with the framed text
    PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(style.FramePadding.x, style.WindowPadding.y));
    bool ret = Begin(name, NULL, window_flags);
    PopStyleVar();
    if (!ret)
    {
        EndPopup();
        IM_ASSERT(0);   // This should never happen as we tested for IsPopupOpen() above
        return false;
    }
    return true;
}